

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

CordRep * absl::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *tree,size_t n)

{
  RefcountAndFlags *pRVar1;
  long lVar2;
  uint8_t uVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  CordRepBtree *pCVar8;
  CordRep *pCVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  size_t sVar13;
  ulong uVar14;
  CordRepBtree *this;
  bool bVar15;
  bool bVar16;
  CopyResult CVar17;
  
  if (tree == (CordRepBtree *)0x0) {
    __assert_fail("tree != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x347,
                  "static CordRep *absl::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *, size_t)"
                 );
  }
  uVar5 = (tree->super_CordRep).length;
  if (uVar5 < n) {
    __assert_fail("n <= tree->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x348,
                  "static CordRep *absl::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *, size_t)"
                 );
  }
  if (n != 0) {
    uVar14 = uVar5 - n;
    if (uVar5 < n || uVar14 == 0) {
      CordRep::Unref(&tree->super_CordRep);
      tree = (CordRepBtree *)0x0;
    }
    else {
      uVar12 = (uint)(tree->super_CordRep).storage[0];
      bVar16 = (tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2;
      uVar5 = (tree->super_CordRep).length;
      if (uVar5 < uVar14) {
LAB_001784b8:
        __assert_fail("n <= length",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x340,
                      "CordRepBtree::Position absl::cord_internal::CordRepBtree::IndexOfLength(size_t) const"
                     );
      }
      uVar11 = (ulong)(tree->super_CordRep).storage[2];
      uVar5 = uVar5 - uVar14;
      do {
        uVar7 = uVar5;
        lVar2 = uVar11 * 8;
        uVar11 = uVar11 - 1;
        uVar10 = **(ulong **)((tree->super_CordRep).storage + lVar2 + -5);
        uVar5 = uVar7 - uVar10;
      } while (uVar10 <= uVar7);
      if ((tree->super_CordRep).storage[1] == uVar11) {
        do {
          tree = (CordRepBtree *)ExtractFront(tree);
          bVar16 = (bool)((tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2 &
                         bVar16);
          bVar15 = uVar12 == 0;
          uVar12 = uVar12 - 1;
          if (bVar15) {
            pCVar9 = anon_unknown_0::ResizeEdge((CordRep *)tree,uVar14,bVar16);
            return pCVar9;
          }
          if ((tree->super_CordRep).tag != '\x03') goto LAB_001784d7;
          uVar5 = (tree->super_CordRep).length;
          if (uVar5 < uVar14) goto LAB_001784b8;
          uVar11 = (ulong)(tree->super_CordRep).storage[2];
          uVar5 = uVar5 - uVar14;
          do {
            uVar7 = uVar5;
            lVar2 = uVar11 * 8;
            uVar11 = uVar11 - 1;
            uVar10 = **(ulong **)((tree->super_CordRep).storage + lVar2 + -5);
            uVar5 = uVar7 - uVar10;
          } while (uVar10 <= uVar7);
        } while ((tree->super_CordRep).storage[1] == uVar11);
        uVar10 = uVar10 - uVar7;
      }
      else {
        uVar10 = uVar10 - uVar7;
      }
      tree = ConsumeBeginTo(tree,uVar11 + 1,uVar14);
      if (uVar11 < (tree->super_CordRep).storage[1]) {
LAB_00178515:
        __assert_fail("index >= begin()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      if ((tree->super_CordRep).storage[2] <= uVar11) {
LAB_001784f6:
        __assert_fail("index < end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                      ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
      }
      this = (CordRepBtree *)tree->edges_[uVar11];
      pCVar8 = tree;
      if (uVar10 != (this->super_CordRep).length) {
        do {
          if ((pCVar8->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
            __assert_fail("tree->refcount.IsOne()",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x36a,
                          "static CordRep *absl::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *, size_t)"
                         );
          }
          iVar4 = (this->super_CordRep).refcount.count_.super___atomic_base<int>._M_i;
          bVar16 = uVar12 == 0;
          uVar12 = uVar12 - 1;
          if (bVar16) {
            pCVar9 = anon_unknown_0::ResizeEdge(&this->super_CordRep,uVar10,iVar4 == 2);
            pCVar8->edges_[uVar11] = pCVar9;
            break;
          }
          uVar3 = (this->super_CordRep).tag;
          if (iVar4 != 2) {
            if (uVar3 != '\x03') {
LAB_001784d7:
              __assert_fail("IsBtree()",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                            ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
            }
            CVar17 = CopyPrefix(this,uVar10,false);
            pCVar8->edges_[uVar11] = CVar17.edge;
            LOCK();
            pRVar1 = &(this->super_CordRep).refcount;
            uVar12 = (pRVar1->count_).super___atomic_base<int>._M_i;
            (pRVar1->count_).super___atomic_base<int>._M_i =
                 (pRVar1->count_).super___atomic_base<int>._M_i + -2;
            UNLOCK();
            if ((uVar12 & 1) == 0 && (int)uVar12 < 1) {
              __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.h"
                            ,0xab,
                            "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()"
                           );
            }
            if (uVar12 == 2) {
              CordRep::Destroy(&this->super_CordRep);
            }
            break;
          }
          if (uVar3 != '\x03') goto LAB_001784d7;
          uVar5 = (this->super_CordRep).length;
          if (uVar5 < uVar10) goto LAB_001784b8;
          uVar5 = uVar5 - uVar10;
          sVar6 = (ulong)(this->super_CordRep).storage[2] + 1;
          do {
            sVar13 = sVar6;
            uVar7 = uVar5;
            uVar14 = **(ulong **)((this->super_CordRep).storage + sVar13 * 8 + -0xd);
            uVar5 = uVar7 - uVar14;
            sVar6 = sVar13 - 1;
          } while (uVar14 <= uVar7);
          pCVar8 = ConsumeBeginTo(this,sVar13 - 1,uVar10);
          uVar11 = sVar13 - 2;
          if (uVar11 < (pCVar8->super_CordRep).storage[1]) goto LAB_00178515;
          if ((pCVar8->super_CordRep).storage[2] <= uVar11) goto LAB_001784f6;
          uVar10 = uVar14 - uVar7;
          this = *(CordRepBtree **)((pCVar8->super_CordRep).storage + sVar13 * 8 + -0xd);
        } while (uVar10 != (this->super_CordRep).length);
      }
      AssertValid(tree,true);
    }
  }
  return &tree->super_CordRep;
}

Assistant:

CordRep* CordRepBtree::RemoveSuffix(CordRepBtree* tree, size_t n) {
  // Check input and deal with trivial cases 'Remove all/none'
  assert(tree != nullptr);
  assert(n <= tree->length);
  const size_t len = tree->length;
  if (ABSL_PREDICT_FALSE(n == 0)) {
    return tree;
  }
  if (ABSL_PREDICT_FALSE(n >= len)) {
    CordRepBtree::Unref(tree);
    return nullptr;
  }

  size_t length = len - n;
  int height = tree->height();
  bool is_mutable = tree->refcount.IsOne();

  // Extract all top nodes which are reduced to size = 1
  Position pos = tree->IndexOfLength(length);
  while (pos.index == tree->begin()) {
    CordRep* edge = ExtractFront(tree);
    is_mutable &= edge->refcount.IsOne();
    if (height-- == 0) return ResizeEdge(edge, length, is_mutable);
    tree = edge->btree();
    pos = tree->IndexOfLength(length);
  }

  // Repeat the following sequence traversing down the tree:
  // - Crop the top node to the 'last remaining edge' adjusting length.
  // - Set the length for down edges to the partial length in that last edge.
  // - Repeat this until the last edge is 'included in full'
  // - If we hit the data edge level, resize and return the last data edge
  CordRepBtree* top = tree = ConsumeBeginTo(tree, pos.index + 1, length);
  CordRep* edge = tree->Edge(pos.index);
  length = pos.n;
  while (length != edge->length) {
    // ConsumeBeginTo guarantees `tree` is a clean, privately owned copy.
    assert(tree->refcount.IsOne());
    const bool edge_is_mutable = edge->refcount.IsOne();

    if (height-- == 0) {
      tree->edges_[pos.index] = ResizeEdge(edge, length, edge_is_mutable);
      return AssertValid(top);
    }

    if (!edge_is_mutable) {
      // We can't 'in place' remove any suffixes down this edge.
      // Replace this edge with a prefix copy instead.
      tree->edges_[pos.index] = edge->btree()->CopyPrefix(length, false).edge;
      CordRep::Unref(edge);
      return AssertValid(top);
    }

    // Move down one level, rinse repeat.
    tree = edge->btree();
    pos = tree->IndexOfLength(length);
    tree = ConsumeBeginTo(edge->btree(), pos.index + 1, length);
    edge = tree->Edge(pos.index);
    length = pos.n;
  }

  return AssertValid(top);
}